

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zm.c
# Opt level: O0

size_t zmCreateBarr_deep(size_t no)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t n;
  size_t in_stack_ffffffffffffffd0;
  
  sVar1 = zzRedBarrStart_deep(in_stack_ffffffffffffffd0);
  sVar2 = zmMulBarr_deep(sVar1);
  sVar3 = zmSqrBarr_deep(sVar1);
  sVar4 = zmInv_deep(0x188cd6);
  sVar5 = zmDiv_deep(0x188ce5);
  sVar1 = utilMax(5,sVar1,sVar2,sVar3,sVar4,sVar5);
  return sVar1;
}

Assistant:

size_t zmCreateBarr_deep(size_t no)
{
	const size_t n = W_OF_O(no);
	return utilMax(5,
		zzRedBarrStart_deep(n),
		zmMulBarr_deep(n),
		zmSqrBarr_deep(n),
		zmInv_deep(n),
		zmDiv_deep(n));
}